

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  long lVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  size_t *psVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int *piVar18;
  ulong uVar19;
  BrotliTransforms *pBVar20;
  uint8_t *puVar21;
  ulong uVar22;
  byte bVar23;
  int iVar24;
  char *pcVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  size_t *psVar29;
  size_t sVar30;
  ulong uVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ushort uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  int *piVar44;
  uint uVar45;
  long lVar46;
  long lVar47;
  size_t *psVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  bool bVar59;
  bool bVar60;
  ulong local_168;
  ulong local_160;
  ulong local_130;
  size_t *local_128;
  long local_f0;
  ulong local_e0;
  ulong local_d8;
  ulong local_b0;
  
  bVar23 = literal_context_lut[8];
  lVar6 = *(long *)(literal_context_lut + 0x10);
  uVar13 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar13 = position;
  }
  lVar47 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar47 = 0x40;
  }
  local_e0 = *(ulong *)dist_cache;
  iVar27 = *(int *)&(hasher->common).extra;
  iVar26 = *(int *)((long)&(hasher->common).extra + 4);
  *(int *)&(hasher->common).dict_num_matches = iVar27 + -1;
  *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar27 + 1;
  (hasher->common).params.type = iVar27 + -2;
  (hasher->common).params.bucket_bits = iVar27 + 2;
  (hasher->common).params.block_bits = iVar27 + -3;
  (hasher->common).params.hash_len = iVar27 + 3;
  (hasher->common).params.num_last_distances_to_check = iVar26 + -1;
  (hasher->common).is_prepared_ = iVar26 + 1;
  *(int *)&hasher->privat = iVar26 + -2;
  *(int *)((long)&hasher->privat + 4) = iVar26 + 2;
  *(int *)((long)&hasher->privat + 8) = iVar26 + -3;
  *(int *)((long)&hasher->privat + 0xc) = iVar26 + 3;
  uVar1 = position + num_bytes;
  if (position + 4 < uVar1) {
    uVar49 = (1L << (bVar23 & 0x3f)) - 0x10;
    local_b0 = lVar47 + position;
    lVar2 = position - 1;
    local_128 = last_insert_len;
    sVar32 = position;
    do {
      uVar15 = uVar49;
      if (sVar32 < uVar49) {
        uVar15 = sVar32;
      }
      uVar43 = lVar6 + sVar32;
      if (uVar49 <= lVar6 + sVar32) {
        uVar43 = uVar49;
      }
      uVar41 = *(ulong *)(literal_context_lut + 0x50);
      uVar31 = sVar32 & ringbuffer_mask;
      iVar27 = *(int *)(ringbuffer + uVar31);
      lVar46 = *(long *)&params[7].dist.alphabet_size_max;
      psVar29 = *(size_t **)backward_references;
      bVar59 = psVar29 < back_refs_position;
      if ((bVar59) && ((ulong)(long)(int)num_literals[(long)psVar29 * 2] < sVar32)) {
        psVar14 = num_literals + (long)psVar29 * 2 + 2;
        psVar48 = psVar29;
        do {
          psVar48 = (size_t *)((long)psVar48 + 1);
          psVar29 = back_refs_position;
          if (back_refs_position == psVar48) break;
          sVar8 = *psVar14;
          psVar14 = psVar14 + 2;
          psVar29 = psVar48;
        } while ((ulong)(long)(int)sVar8 < sVar32);
        *(size_t **)backward_references = psVar48;
        bVar59 = psVar48 < back_refs_position;
      }
      uVar54 = uVar1 - sVar32;
      piVar18 = (int *)(ringbuffer + uVar31);
      if ((bVar59) && (sVar32 == (long)(int)num_literals[(long)psVar29 * 2])) {
        uVar45 = (uint)num_literals[(long)psVar29 * 2 + 1];
        local_160 = (ulong)(int)uVar45;
        bVar60 = true;
        if ((sVar32 - local_160 < sVar32) &&
           (uVar45 <= *(uint *)((long)num_literals + (long)psVar29 * 0x10 + 0xc))) {
          uVar40 = sVar32 - local_160 & ringbuffer_mask;
          if (7 < uVar54) {
            uVar28 = uVar54 & 0xfffffffffffffff8;
            piVar44 = (int *)(ringbuffer + uVar28 + uVar31);
            lVar46 = 0;
            uVar31 = 0;
LAB_0011ad47:
            if (*(ulong *)(piVar18 + uVar31 * 2) == *(ulong *)(ringbuffer + uVar31 * 8 + uVar40))
            goto code_r0x0011ad59;
            uVar40 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar40) ^ *(ulong *)(piVar18 + uVar31 * 2)
            ;
            uVar31 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar46;
            goto LAB_0011ad94;
          }
          uVar28 = 0;
          piVar44 = piVar18;
LAB_0011c02b:
          uVar16 = uVar54 & 7;
          uVar31 = uVar28;
          if (uVar16 != 0) {
            uVar35 = uVar28 | uVar16;
            do {
              uVar31 = uVar28;
              if (ringbuffer[uVar28 + uVar40] != (uint8_t)*piVar44) break;
              piVar44 = (int *)((long)piVar44 + 1);
              uVar28 = uVar28 + 1;
              uVar16 = uVar16 - 1;
              uVar31 = uVar35;
            } while (uVar16 != 0);
          }
LAB_0011ad94:
          uVar28 = (ulong)*(int *)((long)num_literals + (long)psVar29 * 0x10 + 4);
          if (uVar31 < uVar28) {
            uVar28 = uVar31;
          }
          iVar27 = 0x1f;
          if (uVar45 != 0) {
            for (; uVar45 >> iVar27 == 0; iVar27 = iVar27 + -1) {
            }
          }
          uVar40 = (ulong)(iVar27 * -0x1e + 0x780) + uVar28 * 0x87;
          bVar59 = true;
          bVar60 = false;
        }
        else {
          bVar59 = false;
          uVar28 = 0;
          local_160 = 0;
          uVar40 = 0x7e4;
        }
        iVar27 = 0;
        if (bVar60) goto LAB_0011a918;
      }
      else {
        uVar45 = (uint)(iVar27 * 0x1e35a7bd) >> 0x11;
        uVar35 = (ulong)uVar45;
        uVar17 = (ulong)((uint)uVar54 & 7);
        uVar16 = uVar54 & 0xfffffffffffffff8;
        uVar40 = 0x7e4;
        local_168 = 0x7e4;
        local_130 = 0;
        lVar51 = 0;
        uVar28 = 0;
        local_160 = 0;
        do {
          uVar58 = (ulong)*(int *)((long)&(hasher->common).extra + lVar51 * 4);
          uVar33 = sVar32 - uVar58;
          if ((((lVar51 == 0) || (*(char *)(lVar46 + 0x30000 + (uVar33 & 0xffff)) == (char)uVar45))
              && (uVar58 <= uVar15)) && (uVar33 < sVar32)) {
            if (7 < uVar54) {
              lVar56 = 0;
              uVar22 = 0;
LAB_0011a561:
              if (*(ulong *)(piVar18 + uVar22 * 2) ==
                  *(ulong *)(ringbuffer + uVar22 * 8 + (uVar33 & ringbuffer_mask)))
              goto code_r0x0011a573;
              uVar22 = *(ulong *)(ringbuffer + uVar22 * 8 + (uVar33 & ringbuffer_mask)) ^
                       *(ulong *)(piVar18 + uVar22 * 2);
              uVar33 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar22 = (uVar33 >> 3 & 0x1fffffff) - lVar56;
              goto LAB_0011a5b1;
            }
            piVar44 = piVar18;
            uVar55 = 0;
LAB_0011a645:
            uVar22 = uVar55;
            if (uVar17 != 0) {
              uVar37 = uVar17 | uVar55;
              uVar42 = uVar17;
              do {
                uVar22 = uVar55;
                if (ringbuffer[uVar55 + (uVar33 & ringbuffer_mask)] != (uint8_t)*piVar44) break;
                piVar44 = (int *)((long)piVar44 + 1);
                uVar55 = uVar55 + 1;
                uVar42 = uVar42 - 1;
                uVar22 = uVar37;
              } while (uVar42 != 0);
            }
LAB_0011a5b1:
            if ((bVar59) &&
               (uVar33 = (ulong)(int)num_literals[(long)psVar29 * 2], uVar33 < uVar22 + sVar32)) {
              uVar22 = uVar33 - sVar32;
            }
            if ((1 < uVar22) && (uVar33 = uVar22 * 0x87 + 0x78f, local_168 < uVar33)) {
              if (lVar51 != 0) {
                uVar33 = uVar33 - ((0x1ca10U >> ((byte)lVar51 & 0xe) & 0xe) + 0x27);
              }
              if (local_168 < uVar33) {
                uVar40 = uVar33;
                uVar28 = uVar22;
                local_168 = uVar33;
                local_160 = uVar58;
                local_130 = uVar22;
              }
            }
          }
          lVar51 = lVar51 + 1;
        } while (lVar51 != 0x10);
        uVar52 = uVar45 & 0x1ff;
        lVar51._0_4_ = params[7].dist.distance_postfix_bits;
        lVar51._4_4_ = params[7].dist.num_direct_distance_codes;
        uVar55 = sVar32 - *(uint *)(lVar46 + uVar35 * 4);
        uVar3 = *(ushort *)(lVar46 + 0x20000 + uVar35 * 2);
        uVar17 = (ulong)uVar3;
        lVar56 = (ulong)(uVar52 << 0xb) + lVar46 + 0x40000;
        uVar58 = (ulong)((uint)uVar54 & 7);
        uVar22 = 0;
        uVar33 = uVar55;
        do {
          bVar60 = lVar51 == 0;
          lVar51 = lVar51 + -1;
          if (bVar60) break;
          uVar22 = uVar22 + uVar33;
          uVar42 = uVar40;
          uVar37 = uVar28;
          uVar19 = local_168;
          uVar50 = local_160;
          uVar57 = local_130;
          if (uVar22 <= uVar15) {
            uVar34 = (ulong)*(ushort *)(lVar56 + 2 + uVar17 * 4);
            uVar33 = (ulong)*(ushort *)(lVar56 + uVar17 * 4);
            uVar17 = uVar34;
            if (local_130 + uVar31 <= ringbuffer_mask) {
              uVar34 = sVar32 - uVar22 & ringbuffer_mask;
              if ((local_130 + uVar34 <= ringbuffer_mask) &&
                 (ringbuffer[local_130 + uVar31] == ringbuffer[local_130 + uVar34])) {
                if (7 < uVar54) {
                  lVar39 = 0;
                  uVar42 = 0;
LAB_0011a751:
                  if (*(ulong *)(piVar18 + uVar42 * 2) ==
                      *(ulong *)(ringbuffer + uVar42 * 8 + uVar34)) goto code_r0x0011a764;
                  uVar37 = *(ulong *)(ringbuffer + uVar42 * 8 + uVar34) ^
                           *(ulong *)(piVar18 + uVar42 * 2);
                  uVar42 = 0;
                  if (uVar37 != 0) {
                    for (; (uVar37 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar37 = (uVar42 >> 3 & 0x1fffffff) - lVar39;
                  goto LAB_0011a7bd;
                }
                piVar44 = piVar18;
                uVar19 = 0;
LAB_0011a82b:
                uVar37 = uVar19;
                if (uVar58 != 0) {
                  uVar50 = uVar58 | uVar19;
                  uVar42 = uVar58;
                  do {
                    uVar37 = uVar19;
                    if (ringbuffer[uVar19 + uVar34] != (uint8_t)*piVar44) break;
                    piVar44 = (int *)((long)piVar44 + 1);
                    uVar19 = uVar19 + 1;
                    uVar42 = uVar42 - 1;
                    uVar37 = uVar50;
                  } while (uVar42 != 0);
                }
LAB_0011a7bd:
                if ((bVar59) &&
                   (uVar42 = (ulong)(int)num_literals[(long)psVar29 * 2], uVar42 < uVar37 + sVar32))
                {
                  uVar37 = uVar42 - sVar32;
                }
                if (3 < uVar37) {
                  iVar27 = 0x1f;
                  if ((uint)uVar22 != 0) {
                    for (; (uint)uVar22 >> iVar27 == 0; iVar27 = iVar27 + -1) {
                    }
                  }
                  uVar42 = (ulong)(iVar27 * -0x1e + 0x780) + uVar37 * 0x87;
                  uVar19 = uVar42;
                  uVar50 = uVar22;
                  uVar57 = uVar37;
                  if (local_168 < uVar42) goto LAB_0011a798;
                }
                uVar42 = uVar40;
                uVar37 = uVar28;
                uVar19 = local_168;
                uVar50 = local_160;
                uVar57 = local_130;
              }
            }
          }
LAB_0011a798:
          local_130 = uVar57;
          local_160 = uVar50;
          local_168 = uVar19;
          uVar40 = uVar42;
          uVar28 = uVar37;
        } while (uVar22 <= uVar15);
        uVar38 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar52 * 2);
        *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar52 * 2) = uVar38 + 1;
        uVar53 = uVar38 & 0x1ff;
        *(char *)(lVar46 + 0x30000 + (sVar32 & 0xffff)) = (char)uVar45;
        if (0xfffe < uVar55) {
          uVar55 = 0xffff;
        }
        lVar51 = lVar46 + 0x40000 + (ulong)(uVar52 << 0xb);
        *(short *)(lVar51 + (ulong)uVar53 * 4) = (short)uVar55;
        *(ushort *)(lVar51 + 2 + (ulong)uVar53 * 4) = uVar3;
        *(int *)(lVar46 + uVar35 * 4) = (int)sVar32;
        *(short *)(lVar46 + 0x20000 + uVar35 * 2) = (short)uVar53;
        bVar59 = false;
LAB_0011a918:
        iVar27 = 0;
        if (uVar40 == 0x7e4) {
          if (back_refs_position == (size_t *)0x0) {
            sVar8 = params[7].dist.max_distance;
            if (*(ulong *)(sVar8 + 8) >> 7 <= *(ulong *)(sVar8 + 0x10)) {
              uVar15 = (ulong)((uint)(*piVar18 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              lVar46 = *(long *)(literal_context_lut + 0x78);
              lVar51 = *(long *)(sVar8 + 8);
              iVar27 = 0;
              lVar56 = 0;
LAB_0011ab0b:
              lVar51 = lVar51 + 1;
              *(long *)(sVar8 + 8) = lVar51;
              bVar23 = *(byte *)(lVar46 + uVar15);
              uVar31 = (ulong)bVar23;
              if (uVar31 != 0) {
                bVar60 = true;
                if (uVar31 <= uVar54) {
                  uVar16 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar15 * 2);
                  lVar39 = *(long *)(literal_context_lut + 0x58);
                  pcVar25 = (char *)(uVar16 * uVar31 + *(long *)(lVar39 + 0xa8) +
                                    (ulong)*(uint *)(lVar39 + 0x20 + uVar31 * 4));
                  if (7 < bVar23) {
                    uVar17 = (ulong)(bVar23 & 0xfffffff8);
                    lVar36 = 0;
                    uVar35 = 0;
LAB_0011ab78:
                    if (*(ulong *)(pcVar25 + uVar35 * 8) == *(ulong *)(piVar18 + uVar35 * 2))
                    goto code_r0x0011ab8a;
                    uVar17 = *(ulong *)(piVar18 + uVar35 * 2) ^ *(ulong *)(pcVar25 + uVar35 * 8);
                    uVar35 = 0;
                    if (uVar17 != 0) {
                      for (; (uVar17 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    uVar35 = (uVar35 >> 3 & 0x1fffffff) - lVar36;
                    goto LAB_0011abcc;
                  }
                  uVar17 = 0;
                  goto LAB_0011accb;
                }
                goto LAB_0011ac3e;
              }
              goto LAB_0011ac5b;
            }
          }
          else {
            psVar29 = *(size_t **)backward_references;
            if ((psVar29 < back_refs_position) &&
               (sVar32 == (long)(int)num_literals[(long)psVar29 * 2])) {
              uVar45 = (uint)num_literals[(long)psVar29 * 2 + 1];
              if (*(int *)((long)num_literals + (long)psVar29 * 0x10 + 0xc) < (int)uVar45) {
                uVar52 = *(uint *)((long)num_literals + (long)psVar29 * 0x10 + 4);
                uVar43 = (ulong)uVar52;
                bVar59 = true;
                iVar27 = 0;
                if (uVar52 - 4 < 0x15 && (int)uVar45 < 0x7ffffffd) {
                  uVar53 = ~(uint)uVar15 + uVar45;
                  lVar46 = *(long *)(literal_context_lut + 0x58);
                  iVar26 = (int)uVar53 >> (*(byte *)(lVar46 + uVar43) & 0x1f);
                  if (iVar26 < *(int *)(literal_context_lut + 0x60)) {
                    uVar4 = *(uint *)(lVar46 + 0x20 + uVar43 * 4);
                    uVar5 = kBitMask[*(byte *)(lVar46 + uVar43)];
                    lVar46 = *(long *)(lVar46 + 0xa8);
                    pBVar20 = BrotliGetTransforms();
                    puVar21 = (uint8_t *)malloc(uVar43 * 10);
                    iVar27 = BrotliTransformDictionaryWord
                                       (puVar21,(uint8_t *)
                                                ((ulong)uVar4 + lVar46 +
                                                (long)(int)((uVar53 & uVar5) * uVar52)),uVar52,
                                        pBVar20,iVar26);
                    sVar30 = (size_t)iVar27;
                    iVar26 = bcmp(piVar18,puVar21,sVar30);
                    if (iVar26 != 0) goto LAB_0011aac5;
                    iVar26 = 0x1f;
                    if (uVar45 != 0) {
                      for (; uVar45 >> iVar26 == 0; iVar26 = iVar26 + -1) {
                      }
                    }
                    uVar40 = (ulong)(iVar26 * -0x1e + 0x780) + sVar30 * 0x87;
                    iVar27 = uVar52 - iVar27;
                    local_160 = (long)(int)uVar45;
                    uVar28 = sVar30;
                  }
                }
                goto LAB_0011ade2;
              }
            }
          }
LAB_0011aac5:
          iVar27 = 0;
        }
      }
LAB_0011ade2:
      if (uVar40 < 0x7e5) {
        local_e0 = local_e0 + 1;
        position = sVar32 + 1;
        if ((back_refs_position == (size_t *)0x0) && (local_b0 < position)) {
          if ((uint)((int)lVar47 * 4) + local_b0 < position) {
            uVar15 = sVar32 + 0x11;
            if (uVar1 - 4 <= sVar32 + 0x11) {
              uVar15 = uVar1 - 4;
            }
            if (position < uVar15) {
              lVar46 = *(long *)&params[7].dist.alphabet_size_max;
              do {
                uVar45 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         0x11;
                uVar43 = (ulong)uVar45;
                uVar53 = uVar45 & 0x1ff;
                uVar3 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar53 * 2);
                *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar53 * 2) = uVar3 + 1;
                uVar52 = uVar3 & 0x1ff;
                uVar41 = position - *(uint *)(lVar46 + uVar43 * 4);
                if (0xfffe < uVar41) {
                  uVar41 = 0xffff;
                }
                *(char *)(lVar46 + 0x30000 + (position & 0xffff)) = (char)uVar45;
                lVar51 = (ulong)(uVar53 << 0xb) + lVar46 + 0x40000;
                *(short *)(lVar51 + (ulong)uVar52 * 4) = (short)uVar41;
                *(undefined2 *)(lVar51 + 2 + (ulong)uVar52 * 4) =
                     *(undefined2 *)(lVar46 + 0x20000 + uVar43 * 2);
                *(int *)(lVar46 + uVar43 * 4) = (int)position;
                *(short *)(lVar46 + 0x20000 + uVar43 * 2) = (short)uVar52;
                local_e0 = local_e0 + 4;
                position = position + 4;
              } while (position < uVar15);
            }
          }
          else {
            uVar15 = sVar32 + 9;
            if (uVar1 - 3 <= sVar32 + 9) {
              uVar15 = uVar1 - 3;
            }
            if (position < uVar15) {
              lVar46 = *(long *)&params[7].dist.alphabet_size_max;
              do {
                uVar45 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         0x11;
                uVar43 = (ulong)uVar45;
                uVar53 = uVar45 & 0x1ff;
                uVar3 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar53 * 2);
                *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar53 * 2) = uVar3 + 1;
                uVar52 = uVar3 & 0x1ff;
                uVar41 = position - *(uint *)(lVar46 + uVar43 * 4);
                if (0xfffe < uVar41) {
                  uVar41 = 0xffff;
                }
                *(char *)(lVar46 + 0x30000 + (position & 0xffff)) = (char)uVar45;
                lVar51 = (ulong)(uVar53 << 0xb) + lVar46 + 0x40000;
                *(short *)(lVar51 + (ulong)uVar52 * 4) = (short)uVar41;
                *(undefined2 *)(lVar51 + 2 + (ulong)uVar52 * 4) =
                     *(undefined2 *)(lVar46 + 0x20000 + uVar43 * 2);
                *(int *)(lVar46 + uVar43 * 4) = (int)position;
                *(short *)(lVar46 + 0x20000 + uVar43 * 2) = (short)uVar52;
                local_e0 = local_e0 + 2;
                position = position + 2;
              } while (position < uVar15);
            }
          }
        }
      }
      else {
        if (!bVar59) {
          uVar15 = (lVar2 + num_bytes) - sVar32;
          iVar26 = 0;
          local_d8 = local_160;
LAB_0011af8f:
          uVar43 = uVar15 >> 3;
          uVar54 = uVar54 - 1;
          local_130 = uVar28 - 1;
          if (uVar54 <= uVar28 - 1) {
            local_130 = uVar54;
          }
          if (4 < *(int *)(literal_context_lut + 4)) {
            local_130 = 0;
          }
          uVar41 = sVar32 + 1;
          uVar31 = uVar49;
          if (uVar41 < uVar49) {
            uVar31 = uVar41;
          }
          uVar16 = lVar6 + sVar32 + 1;
          if (uVar49 <= uVar16) {
            uVar16 = uVar49;
          }
          uVar35 = *(ulong *)(literal_context_lut + 0x50);
          lVar46 = *(long *)&params[7].dist.alphabet_size_max;
          uVar17 = uVar41 & ringbuffer_mask;
          iVar12 = *(int *)(ringbuffer + uVar17);
          piVar18 = (int *)(ringbuffer + uVar17);
          psVar29 = *(size_t **)backward_references;
          bVar59 = psVar29 < back_refs_position;
          if (!bVar59) {
LAB_0011b139:
            uVar45 = (uint)(iVar12 * 0x1e35a7bd) >> 0x11;
            uVar55 = (ulong)uVar45;
            uVar22 = (ulong)((uint)uVar54 & 7);
            local_168 = 0x7e4;
            lVar51 = 0;
            uVar58 = 0;
            local_160 = 0;
            uVar33 = 0x7e4;
LAB_0011b177:
            uVar37 = (ulong)*(int *)((long)&(hasher->common).extra + lVar51 * 4);
            uVar42 = uVar41 - uVar37;
            if ((((lVar51 == 0) || (*(char *)(lVar46 + 0x30000 + (uVar42 & 0xffff)) == (char)uVar45)
                 ) && (uVar37 <= uVar31)) && (uVar42 < uVar41)) {
              uVar19 = uVar22;
              if (7 < uVar54) {
                lVar56 = 0;
                uVar50 = 0;
LAB_0011b1c9:
                if (*(ulong *)(piVar18 + uVar50 * 2) ==
                    *(ulong *)(ringbuffer + uVar50 * 8 + (uVar42 & ringbuffer_mask)))
                goto code_r0x0011b1da;
                uVar19 = *(ulong *)(ringbuffer + uVar50 * 8 + (uVar42 & ringbuffer_mask)) ^
                         *(ulong *)(piVar18 + uVar50 * 2);
                uVar42 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar50 = (uVar42 >> 3 & 0x1fffffff) - lVar56;
                goto LAB_0011b214;
              }
              uVar50 = 0;
              piVar44 = piVar18;
              goto joined_r0x0011b2a4;
            }
            goto LAB_0011b28c;
          }
          if ((ulong)(long)(int)num_literals[(long)psVar29 * 2] < uVar41) {
            psVar48 = num_literals + (long)psVar29 * 2 + 2;
            do {
              psVar29 = (size_t *)((long)psVar29 + 1);
              if (back_refs_position == psVar29) {
                *(size_t **)backward_references = psVar29;
                bVar59 = false;
                psVar29 = back_refs_position;
                goto LAB_0011b139;
              }
              sVar8 = *psVar48;
              psVar48 = psVar48 + 2;
            } while ((ulong)(long)(int)sVar8 < uVar41);
            *(size_t **)backward_references = psVar29;
            bVar59 = psVar29 < back_refs_position;
          }
          if ((!bVar59) || (uVar41 != (long)(int)num_literals[(long)psVar29 * 2]))
          goto LAB_0011b139;
          uVar45 = (uint)num_literals[(long)psVar29 * 2 + 1];
          local_160 = (ulong)(int)uVar45;
          uVar33 = 0x7e4;
          bVar60 = true;
          if ((uVar41 - local_160 < uVar41) &&
             (uVar45 <= *(uint *)((long)num_literals + (long)psVar29 * 0x10 + 0xc))) {
            uVar17 = uVar41 - local_160 & ringbuffer_mask;
            if (7 < uVar54) {
              lVar46 = 0;
              uVar33 = 0;
LAB_0011b9e7:
              if (*(ulong *)(piVar18 + uVar33 * 2) == *(ulong *)(ringbuffer + uVar33 * 8 + uVar17))
              goto code_r0x0011b9f8;
              uVar17 = *(ulong *)(ringbuffer + uVar33 * 8 + uVar17) ^
                       *(ulong *)(piVar18 + uVar33 * 2);
              uVar43 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
              uVar43 = (uVar43 >> 3 & 0x1fffffff) - lVar46;
              goto LAB_0011ba28;
            }
            uVar43 = 0;
            piVar44 = piVar18;
            goto LAB_0011bad2;
          }
          bVar59 = false;
          uVar58 = 0;
          local_160 = 0;
          goto LAB_0011ba64;
        }
LAB_0011ae06:
        uVar15 = lVar6 + sVar32;
        if (uVar49 <= lVar6 + sVar32) {
          uVar15 = uVar49;
        }
        if (uVar15 < local_160) {
LAB_0011bc05:
          uVar43 = local_160 + 0xf;
        }
        else {
          uVar43 = (ulong)*(int *)&(hasher->common).extra;
          uVar45 = 0;
          bVar59 = false;
          if (local_160 != uVar43) {
            uVar41 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
            if (local_160 == uVar41) {
              uVar45 = 1;
              bVar59 = false;
            }
            else {
              uVar43 = (local_160 + 3) - uVar43;
              if (uVar43 < 7) {
                bVar23 = (byte)((int)uVar43 << 2);
                uVar45 = 0x9750468;
LAB_0011bbf2:
                uVar45 = uVar45 >> (bVar23 & 0x1f) & 0xf;
              }
              else {
                uVar41 = (local_160 + 3) - uVar41;
                if (uVar41 < 7) {
                  bVar23 = (byte)((int)uVar41 << 2);
                  uVar45 = 0xfdb1ace;
                  goto LAB_0011bbf2;
                }
                if (local_160 != (long)(int)(hasher->common).dict_num_lookups) {
                  bVar59 = local_160 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)
                  ;
                  uVar45 = 3;
                  goto LAB_0011bbfe;
                }
                uVar45 = 2;
              }
              bVar59 = false;
            }
          }
LAB_0011bbfe:
          if (bVar59) goto LAB_0011bc05;
          uVar43 = (ulong)uVar45;
        }
        if ((local_160 <= uVar15) && (uVar43 != 0)) {
          (hasher->common).dict_num_lookups = *(size_t *)((long)&(hasher->common).extra + 4);
          iVar26 = *(int *)&(hasher->common).extra;
          *(int *)((long)&(hasher->common).extra + 4) = iVar26;
          iVar12 = (int)local_160;
          *(int *)&(hasher->common).extra = iVar12;
          *(int *)&(hasher->common).dict_num_matches = iVar12 + -1;
          *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar12 + 1;
          (hasher->common).params.type = iVar12 + -2;
          (hasher->common).params.bucket_bits = iVar12 + 2;
          (hasher->common).params.block_bits = iVar12 + -3;
          (hasher->common).params.hash_len = iVar12 + 3;
          (hasher->common).params.num_last_distances_to_check = iVar26 + -1;
          (hasher->common).is_prepared_ = iVar26 + 1;
          *(int *)&hasher->privat = iVar26 + -2;
          *(int *)((long)&hasher->privat + 4) = iVar26 + 2;
          *(int *)((long)&hasher->privat + 8) = iVar26 + -3;
          *(int *)((long)&hasher->privat + 0xc) = iVar26 + 3;
        }
        uVar45 = (uint)local_e0;
        *(uint *)local_128 = uVar45;
        *(uint *)((long)local_128 + 4) = iVar27 << 0x19 | (uint)uVar28;
        uVar15 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
        if (uVar43 < uVar15) {
          *(short *)((long)local_128 + 0xe) = (short)uVar43;
          uVar52 = 0;
        }
        else {
          bVar23 = (byte)*(int *)(literal_context_lut + 0x40);
          uVar43 = ((uVar43 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar23 & 0x3f))) -
                   0x10;
          uVar52 = 0x1f;
          if ((uint)uVar43 != 0) {
            for (; (uint)uVar43 >> uVar52 == 0; uVar52 = uVar52 - 1) {
            }
          }
          uVar52 = (uVar52 ^ 0xffffffe0) + 0x1f;
          bVar59 = (uVar43 >> ((ulong)uVar52 & 0x3f) & 1) != 0;
          iVar26 = uVar52 - *(int *)(literal_context_lut + 0x40);
          *(ushort *)((long)local_128 + 0xe) =
               (short)((uint)bVar59 + iVar26 * 2 + 0xfffe << (bVar23 & 0x3f)) +
               (short)uVar15 + (~(ushort)(-1 << (bVar23 & 0x1f)) & (ushort)uVar43) |
               (short)iVar26 * 0x400;
          uVar52 = (uint)(uVar43 - ((ulong)bVar59 + 2 << ((byte)uVar52 & 0x3f)) >> (bVar23 & 0x3f));
        }
        *(uint *)(local_128 + 1) = uVar52;
        if (5 < local_e0) {
          if (local_e0 < 0x82) {
            uVar45 = 0x1f;
            uVar52 = (uint)(local_e0 - 2);
            if (uVar52 != 0) {
              for (; uVar52 >> uVar45 == 0; uVar45 = uVar45 - 1) {
              }
            }
            uVar45 = (int)(local_e0 - 2 >> ((char)(uVar45 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar45 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_e0 < 0x842) {
            uVar52 = 0x1f;
            if (uVar45 - 0x42 != 0) {
              for (; uVar45 - 0x42 >> uVar52 == 0; uVar52 = uVar52 - 1) {
              }
            }
            uVar45 = (uVar52 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar45 = 0x15;
            if (0x1841 < local_e0) {
              uVar45 = (uint)(ushort)(0x17 - (local_e0 < 0x5842));
            }
          }
        }
        uVar52 = iVar27 + (uint)uVar28;
        if (uVar52 < 10) {
          uVar53 = uVar52 - 2;
        }
        else if (uVar52 < 0x86) {
          uVar52 = uVar52 - 6;
          uVar53 = 0x1f;
          if (uVar52 != 0) {
            for (; uVar52 >> uVar53 == 0; uVar53 = uVar53 - 1) {
            }
          }
          uVar53 = (int)((ulong)(long)(int)uVar52 >> ((char)(uVar53 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar53 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar53 = 0x17;
          if (uVar52 < 0x846) {
            uVar53 = 0x1f;
            if (uVar52 - 0x46 != 0) {
              for (; uVar52 - 0x46 >> uVar53 == 0; uVar53 = uVar53 - 1) {
              }
            }
            uVar53 = (uVar53 ^ 0xffe0) + 0x2c;
          }
        }
        uVar3 = (ushort)uVar53;
        uVar38 = (uVar3 & 7) + ((ushort)uVar45 & 7) * 8;
        if ((((*(ushort *)((long)local_128 + 0xe) & 0x3ff) == 0) && ((ushort)uVar45 < 8)) &&
           (uVar3 < 0x10)) {
          if (7 < uVar3) {
            uVar38 = uVar38 | 0x40;
          }
        }
        else {
          iVar27 = ((uVar45 & 0xffff) >> 3) * 3 + ((uVar53 & 0xffff) >> 3);
          uVar38 = uVar38 + ((ushort)(0x520d40 >> ((char)iVar27 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar27 * 0x40 + 0x40;
        }
        *(ushort *)((long)local_128 + 0xc) = uVar38;
        *num_commands = *num_commands + local_e0;
        position = uVar28 + sVar32;
        uVar15 = uVar13;
        if (position < uVar13) {
          uVar15 = position;
        }
        uVar43 = sVar32 + 2;
        if (local_160 < uVar28 >> 2) {
          uVar41 = position + local_160 * -4;
          if (uVar41 < uVar43) {
            uVar41 = uVar43;
          }
          uVar43 = uVar41;
          if (uVar15 < uVar41) {
            uVar43 = uVar15;
          }
        }
        local_b0 = lVar47 + uVar28 * 2 + sVar32;
        local_128 = local_128 + 2;
        if (uVar43 < uVar15) {
          lVar46 = *(long *)&params[7].dist.alphabet_size_max;
          do {
            uVar45 = (uint)(*(int *)(ringbuffer + (uVar43 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
            uVar31 = (ulong)uVar45;
            uVar53 = uVar45 & 0x1ff;
            uVar3 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar53 * 2);
            *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar53 * 2) = uVar3 + 1;
            uVar52 = uVar3 & 0x1ff;
            uVar41 = uVar43 - *(uint *)(lVar46 + uVar31 * 4);
            *(char *)(lVar46 + 0x30000 + (uVar43 & 0xffff)) = (char)uVar45;
            if (0xfffe < uVar41) {
              uVar41 = 0xffff;
            }
            lVar51 = (ulong)(uVar53 << 0xb) + lVar46 + 0x40000;
            *(short *)(lVar51 + (ulong)uVar52 * 4) = (short)uVar41;
            *(undefined2 *)(lVar51 + 2 + (ulong)uVar52 * 4) =
                 *(undefined2 *)(lVar46 + 0x20000 + uVar31 * 2);
            *(int *)(lVar46 + uVar31 * 4) = (int)uVar43;
            *(short *)(lVar46 + 0x20000 + uVar31 * 2) = (short)uVar52;
            uVar43 = uVar43 + 1;
          } while (uVar15 != uVar43);
          local_e0 = 0;
        }
        else {
          local_e0 = 0;
        }
      }
      sVar32 = position;
    } while (position + 4 < uVar1);
  }
  else {
    local_128 = last_insert_len;
  }
  *(ulong *)dist_cache = (local_e0 + uVar1) - position;
  *(long *)commands = *(long *)commands + ((long)local_128 - (long)last_insert_len >> 4);
  return;
code_r0x0011a573:
  uVar22 = uVar22 + 1;
  lVar56 = lVar56 + -8;
  piVar44 = (int *)(ringbuffer + uVar16 + uVar31);
  uVar55 = uVar16;
  if (uVar54 >> 3 == uVar22) goto LAB_0011a645;
  goto LAB_0011a561;
code_r0x0011a764:
  uVar42 = uVar42 + 1;
  lVar39 = lVar39 + -8;
  piVar44 = (int *)(ringbuffer + uVar16 + uVar31);
  uVar19 = uVar16;
  if (uVar54 >> 3 == uVar42) goto LAB_0011a82b;
  goto LAB_0011a751;
code_r0x0011ad59:
  uVar31 = uVar31 + 1;
  lVar46 = lVar46 + -8;
  if (uVar54 >> 3 == uVar31) goto LAB_0011c02b;
  goto LAB_0011ad47;
code_r0x0011ab8a:
  uVar35 = uVar35 + 1;
  lVar36 = lVar36 + -8;
  if (bVar23 >> 3 == uVar35) goto code_r0x0011ab96;
  goto LAB_0011ab78;
code_r0x0011ab96:
  pcVar25 = pcVar25 + -lVar36;
LAB_0011accb:
  uVar33 = uVar31 & 7;
  uVar35 = uVar17;
  if ((bVar23 & 7) != 0) {
    uVar58 = uVar17 | uVar33;
    do {
      uVar35 = uVar17;
      if (*(char *)((long)piVar18 + uVar17) != *pcVar25) break;
      pcVar25 = pcVar25 + 1;
      uVar17 = uVar17 + 1;
      uVar33 = uVar33 - 1;
      uVar35 = uVar58;
    } while (uVar33 != 0);
  }
LAB_0011abcc:
  bVar60 = true;
  if (((uVar35 != 0) && (uVar31 < *(uint *)(literal_context_lut + 100) + uVar35)) &&
     (uVar31 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar31 - uVar35) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar31 - uVar35) * 4 << (*(byte *)(lVar39 + uVar31) & 0x3f)) + uVar16 + uVar43 + 1,
     uVar31 <= uVar41)) {
    iVar26 = 0x1f;
    if ((uint)uVar31 != 0) {
      for (; (uint)uVar31 >> iVar26 == 0; iVar26 = iVar26 + -1) {
      }
    }
    uVar16 = (uVar35 * 0x87 - (ulong)(uint)(iVar26 * 0x1e)) + 0x780;
    if (uVar40 <= uVar16) {
      iVar27 = (uint)bVar23 - (int)uVar35;
      bVar60 = false;
      uVar40 = uVar16;
      uVar28 = uVar35;
      local_160 = uVar31;
    }
  }
LAB_0011ac3e:
  if (!bVar60) {
    *(long *)(sVar8 + 0x10) = *(long *)(sVar8 + 0x10) + 1;
  }
LAB_0011ac5b:
  uVar15 = uVar15 + 1;
  bVar60 = lVar56 != 0;
  lVar56 = lVar56 + 1;
  if (bVar60) goto LAB_0011ade2;
  goto LAB_0011ab0b;
code_r0x0011b1da:
  uVar50 = uVar50 + 1;
  lVar56 = lVar56 + -8;
  if (uVar43 == uVar50) goto code_r0x0011b1eb;
  goto LAB_0011b1c9;
code_r0x0011b1eb:
  uVar50 = -lVar56;
  piVar44 = (int *)((long)piVar18 - lVar56);
joined_r0x0011b2a4:
  for (; (uVar19 != 0 && (ringbuffer[uVar50 + (uVar42 & ringbuffer_mask)] == (uint8_t)*piVar44));
      uVar50 = uVar50 + 1) {
    uVar19 = uVar19 - 1;
    piVar44 = (int *)((long)piVar44 + 1);
  }
LAB_0011b214:
  if ((bVar59) && (uVar42 = (ulong)(int)num_literals[(long)psVar29 * 2], uVar42 < uVar50 + uVar41))
  {
    uVar50 = uVar42 - uVar41;
  }
  if ((1 < uVar50) && (uVar42 = uVar50 * 0x87 + 0x78f, local_168 < uVar42)) {
    if (lVar51 != 0) {
      uVar42 = uVar42 - ((0x1ca10U >> ((byte)lVar51 & 0xe) & 0xe) + 0x27);
    }
    if (local_168 < uVar42) {
      uVar58 = uVar50;
      uVar33 = uVar42;
      local_168 = uVar42;
      local_160 = uVar37;
      local_130 = uVar50;
    }
  }
LAB_0011b28c:
  lVar51 = lVar51 + 1;
  if (lVar51 == 0x10) goto LAB_0011b2ca;
  goto LAB_0011b177;
LAB_0011b2ca:
  uVar52 = uVar45 & 0x1ff;
  lVar56._0_4_ = params[7].dist.distance_postfix_bits;
  lVar56._4_4_ = params[7].dist.num_direct_distance_codes;
  uVar50 = uVar41 - *(uint *)(lVar46 + uVar55 * 4);
  uVar3 = *(ushort *)(lVar46 + 0x20000 + uVar55 * 2);
  uVar42 = (ulong)uVar3;
  lVar51 = (ulong)(uVar52 << 0xb) + lVar46 + 0x40000;
  uVar37 = (ulong)((uint)uVar54 & 7);
  uVar19 = 0;
  uVar22 = uVar50;
LAB_0011b330:
  bVar60 = lVar56 != 0;
  lVar56 = lVar56 + -1;
  if (bVar60) {
    uVar19 = uVar19 + uVar22;
    uVar34 = uVar33;
    uVar57 = uVar58;
    uVar9 = local_168;
    uVar10 = local_160;
    uVar11 = local_130;
    if (uVar19 <= uVar31) {
      uVar57 = (ulong)*(ushort *)(lVar51 + 2 + uVar42 * 4);
      uVar22 = (ulong)*(ushort *)(lVar51 + uVar42 * 4);
      uVar42 = uVar57;
      if (uVar17 + local_130 <= ringbuffer_mask) {
        uVar34 = uVar41 - uVar19 & ringbuffer_mask;
        if ((ringbuffer_mask < local_130 + uVar34) ||
           (ringbuffer[uVar17 + local_130] != ringbuffer[local_130 + uVar34])) goto LAB_0011b45e;
        uVar9 = uVar37;
        if (7 < uVar54) {
          local_f0 = 0;
          uVar57 = 0;
LAB_0011b3bc:
          if (*(ulong *)(piVar18 + uVar57 * 2) == *(ulong *)(ringbuffer + uVar57 * 8 + uVar34))
          goto code_r0x0011b3cd;
          uVar34 = *(ulong *)(ringbuffer + uVar57 * 8 + uVar34) ^ *(ulong *)(piVar18 + uVar57 * 2);
          uVar57 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
            }
          }
          uVar57 = (uVar57 >> 3 & 0x1fffffff) - local_f0;
          goto LAB_0011b40d;
        }
        uVar57 = 0;
        piVar44 = piVar18;
        goto joined_r0x0011b48a;
      }
      goto LAB_0011b45e;
    }
    goto LAB_0011b464;
  }
  goto LAB_0011b4d7;
code_r0x0011b3cd:
  uVar57 = uVar57 + 1;
  local_f0 = local_f0 + -8;
  if (uVar43 == uVar57) goto code_r0x0011b3e3;
  goto LAB_0011b3bc;
code_r0x0011b3e3:
  uVar57 = -local_f0;
  piVar44 = (int *)((long)piVar18 - local_f0);
joined_r0x0011b48a:
  for (; (uVar9 != 0 && (ringbuffer[uVar57 + uVar34] == (uint8_t)*piVar44)); uVar57 = uVar57 + 1) {
    uVar9 = uVar9 - 1;
    piVar44 = (int *)((long)piVar44 + 1);
  }
LAB_0011b40d:
  if ((bVar59) && (uVar34 = (ulong)(int)num_literals[(long)psVar29 * 2], uVar34 < uVar57 + uVar41))
  {
    uVar57 = uVar34 - uVar41;
  }
  if (3 < uVar57) {
    iVar12 = 0x1f;
    if ((uint)uVar19 != 0) {
      for (; (uint)uVar19 >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    uVar34 = (ulong)(iVar12 * -0x1e + 0x780) + uVar57 * 0x87;
    uVar9 = uVar34;
    uVar10 = uVar19;
    uVar11 = uVar57;
    if (local_168 < uVar34) goto LAB_0011b464;
  }
LAB_0011b45e:
  uVar34 = uVar33;
  uVar57 = uVar58;
  uVar9 = local_168;
  uVar10 = local_160;
  uVar11 = local_130;
LAB_0011b464:
  local_130 = uVar11;
  local_160 = uVar10;
  local_168 = uVar9;
  uVar58 = uVar57;
  uVar33 = uVar34;
  if (uVar31 < uVar19) goto LAB_0011b4d7;
  goto LAB_0011b330;
LAB_0011b4d7:
  uVar38 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar52 * 2);
  *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar52 * 2) = uVar38 + 1;
  uVar53 = uVar38 & 0x1ff;
  *(char *)(lVar46 + 0x30000 + (uVar41 & 0xffff)) = (char)uVar45;
  if (0xfffe < uVar50) {
    uVar50 = 0xffff;
  }
  lVar51 = lVar46 + 0x40000 + (ulong)(uVar52 << 0xb);
  *(short *)(lVar51 + (ulong)uVar53 * 4) = (short)uVar50;
  *(ushort *)(lVar51 + 2 + (ulong)uVar53 * 4) = uVar3;
  *(int *)(lVar46 + uVar55 * 4) = (int)uVar41;
  *(short *)(lVar46 + 0x20000 + uVar55 * 2) = (short)uVar53;
  bVar59 = false;
  goto LAB_0011b576;
code_r0x0011b9f8:
  uVar33 = uVar33 + 1;
  lVar46 = lVar46 + -8;
  if (uVar43 == uVar33) goto code_r0x0011ba09;
  goto LAB_0011b9e7;
code_r0x0011ba09:
  uVar43 = -lVar46;
  piVar44 = (int *)((long)piVar18 - lVar46);
LAB_0011bad2:
  uVar33 = uVar54 & 7;
  for (; (uVar33 != 0 && (ringbuffer[uVar43 + uVar17] == (uint8_t)*piVar44)); uVar43 = uVar43 + 1) {
    piVar44 = (int *)((long)piVar44 + 1);
    uVar33 = uVar33 - 1;
  }
LAB_0011ba28:
  uVar58 = (ulong)*(int *)((long)num_literals + (long)psVar29 * 0x10 + 4);
  if (uVar43 < uVar58) {
    uVar58 = uVar43;
  }
  iVar12 = 0x1f;
  if (uVar45 != 0) {
    for (; uVar45 >> iVar12 == 0; iVar12 = iVar12 + -1) {
    }
  }
  uVar33 = (ulong)(iVar12 * -0x1e + 0x780) + uVar58 * 0x87;
  bVar59 = true;
  bVar60 = false;
LAB_0011ba64:
  iVar12 = 0;
  if (!bVar60) goto LAB_0011b6e0;
LAB_0011b576:
  iVar12 = 0;
  if (uVar33 == 0x7e4) {
    if (back_refs_position == (size_t *)0x0) {
      sVar8 = params[7].dist.max_distance;
      if (*(ulong *)(sVar8 + 8) >> 7 <= *(ulong *)(sVar8 + 0x10)) {
        uVar43 = (ulong)((uint)(*piVar18 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        lVar46 = *(long *)(literal_context_lut + 0x78);
        lVar51 = *(long *)(sVar8 + 8);
        iVar12 = 0;
        lVar56 = 0;
LAB_0011b7d8:
        lVar51 = lVar51 + 1;
        *(long *)(sVar8 + 8) = lVar51;
        bVar23 = *(byte *)(lVar46 + uVar43);
        uVar31 = (ulong)bVar23;
        if (uVar31 != 0) {
          bVar60 = true;
          if (uVar31 <= uVar54) {
            uVar17 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar43 * 2);
            lVar39 = *(long *)(literal_context_lut + 0x58);
            pcVar25 = (char *)(uVar17 * uVar31 + *(long *)(lVar39 + 0xa8) +
                              (ulong)*(uint *)(lVar39 + 0x20 + uVar31 * 4));
            if (7 < bVar23) {
              uVar55 = (ulong)(bVar23 & 0xfffffff8);
              lVar36 = 0;
              uVar22 = 0;
LAB_0011b83f:
              if (*(ulong *)(pcVar25 + uVar22 * 8) == *(ulong *)(piVar18 + uVar22 * 2))
              goto code_r0x0011b850;
              uVar55 = *(ulong *)(piVar18 + uVar22 * 2) ^ *(ulong *)(pcVar25 + uVar22 * 8);
              uVar22 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = (uVar22 >> 3 & 0x1fffffff) - lVar36;
              goto LAB_0011b896;
            }
            uVar55 = 0;
            goto LAB_0011b958;
          }
          goto LAB_0011b8f3;
        }
        goto LAB_0011b900;
      }
    }
    else {
      psVar29 = *(size_t **)backward_references;
      if ((psVar29 < back_refs_position) && (uVar41 == (long)(int)num_literals[(long)psVar29 * 2]))
      {
        uVar45 = (uint)num_literals[(long)psVar29 * 2 + 1];
        if (*(int *)((long)num_literals + (long)psVar29 * 0x10 + 0xc) < (int)uVar45) {
          uVar52 = *(uint *)((long)num_literals + (long)psVar29 * 0x10 + 4);
          uVar43 = (ulong)uVar52;
          bVar59 = true;
          if (uVar52 - 4 < 0x15 && (int)uVar45 < 0x7ffffffd) {
            uVar53 = ~(uint)uVar31 + uVar45;
            lVar46 = *(long *)(literal_context_lut + 0x58);
            iVar24 = (int)uVar53 >> (*(byte *)(lVar46 + uVar43) & 0x1f);
            if (iVar24 < *(int *)(literal_context_lut + 0x60)) {
              uVar4 = *(uint *)(lVar46 + 0x20 + uVar43 * 4);
              uVar5 = kBitMask[*(byte *)(lVar46 + uVar43)];
              lVar46 = *(long *)(lVar46 + 0xa8);
              pBVar20 = BrotliGetTransforms();
              puVar21 = (uint8_t *)malloc(uVar43 * 10);
              iVar12 = BrotliTransformDictionaryWord
                                 (puVar21,(uint8_t *)
                                          ((ulong)uVar4 + lVar46 +
                                          (long)(int)((uVar53 & uVar5) * uVar52)),uVar52,pBVar20,
                                  iVar24);
              sVar30 = (size_t)iVar12;
              iVar24 = bcmp(piVar18,puVar21,sVar30);
              if (iVar24 == 0) {
                iVar24 = 0x1f;
                if (uVar45 != 0) {
                  for (; uVar45 >> iVar24 == 0; iVar24 = iVar24 + -1) {
                  }
                }
                uVar33 = (ulong)(iVar24 * -0x1e + 0x780) + sVar30 * 0x87;
                iVar12 = uVar52 - iVar12;
                uVar58 = sVar30;
                local_160 = (long)(int)uVar45;
              }
              else {
                iVar12 = 0;
              }
            }
          }
        }
      }
    }
  }
LAB_0011b6e0:
  bVar60 = true;
  if ((bVar59) || (uVar43 = sVar32, uVar40 + 0xaf <= uVar33)) {
    local_e0 = local_e0 + 1;
    iVar24 = iVar26 + 1;
    bVar7 = iVar26 < 3;
    uVar40 = uVar33;
    uVar28 = uVar58;
    local_d8 = local_160;
    uVar43 = uVar41;
    iVar27 = iVar12;
    iVar26 = iVar24;
    if (bVar7 && !bVar59) {
      bVar60 = uVar1 <= sVar32 + 5;
    }
  }
  sVar32 = uVar43;
  uVar15 = uVar15 - 1;
  local_160 = local_d8;
  if (bVar60) goto LAB_0011ae06;
  goto LAB_0011af8f;
code_r0x0011b850:
  uVar22 = uVar22 + 1;
  lVar36 = lVar36 + -8;
  if (bVar23 >> 3 == uVar22) goto code_r0x0011b85c;
  goto LAB_0011b83f;
code_r0x0011b85c:
  pcVar25 = pcVar25 + -lVar36;
LAB_0011b958:
  uVar42 = uVar31 & 7;
  uVar22 = uVar55;
  if ((bVar23 & 7) != 0) {
    uVar37 = uVar55 | uVar42;
    do {
      uVar22 = uVar55;
      if (*(char *)((long)piVar18 + uVar55) != *pcVar25) break;
      pcVar25 = pcVar25 + 1;
      uVar55 = uVar55 + 1;
      uVar42 = uVar42 - 1;
      uVar22 = uVar37;
    } while (uVar42 != 0);
  }
LAB_0011b896:
  if (((uVar22 == 0) || (*(uint *)(literal_context_lut + 100) + uVar22 <= uVar31)) ||
     (uVar31 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar31 - uVar22) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar31 - uVar22) * 4 << (*(byte *)(lVar39 + uVar31) & 0x3f)) + uVar17 + uVar16 + 1,
     uVar35 < uVar31)) {
    bVar60 = true;
  }
  else {
    iVar24 = 0x1f;
    if ((uint)uVar31 != 0) {
      for (; (uint)uVar31 >> iVar24 == 0; iVar24 = iVar24 + -1) {
      }
    }
    uVar17 = (uVar22 * 0x87 - (ulong)(uint)(iVar24 * 0x1e)) + 0x780;
    bVar60 = true;
    if (uVar33 <= uVar17) {
      iVar12 = (uint)bVar23 - (int)uVar22;
      bVar60 = false;
      uVar33 = uVar17;
      uVar58 = uVar22;
      local_160 = uVar31;
    }
  }
LAB_0011b8f3:
  if (!bVar60) {
    *(long *)(sVar8 + 0x10) = *(long *)(sVar8 + 0x10) + 1;
  }
LAB_0011b900:
  uVar43 = uVar43 + 1;
  bVar60 = lVar56 != 0;
  lVar56 = lVar56 + 1;
  if (bVar60) goto LAB_0011b6e0;
  goto LAB_0011b7d8;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}